

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k054539.c
# Opt level: O2

void k054539_w(void *chip,UINT16 offset,UINT8 data)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  undefined1 *puVar5;
  undefined1 *puVar6;
  
  uVar2 = (uint)offset;
  if ((*(byte *)((long)chip + 0x8d8) & 4) == 0) {
    bVar1 = 0;
LAB_0015a1cf:
    switch(uVar2) {
    case 0x227:
switchD_0015a1e8_caseD_227:
      *(undefined1 *)((long)chip + 0xbc8) = 0;
      break;
    case 0x228:
    case 0x229:
    case 0x22a:
    case 0x22b:
    case 0x22c:
      break;
    case 0x22d:
      iVar4 = *(int *)((long)chip + 0xb1c) + 1;
      if (iVar4 == *(int *)((long)chip + 0xb20)) {
        iVar4 = 0;
      }
      *(int *)((long)chip + 0xb1c) = iVar4;
      break;
    case 0x22e:
      *(ulong *)((long)chip + 0xb28) = (ulong)data * 0x20000 + *(long *)((long)chip + 0xb30);
      *(undefined4 *)((long)chip + 0xb20) = 0x20000;
      *(undefined4 *)((long)chip + 0xb1c) = 0;
      break;
    case 0x22f:
      if ((data & 0x20) == 0) goto switchD_0015a1e8_caseD_227;
      break;
    default:
      if (uVar2 == 0x214) {
        if (bVar1 == 0) {
          for (uVar2 = 0; uVar2 != 8; uVar2 = uVar2 + 1) {
            if (((data >> (uVar2 & 0x1f) & 1) != 0) && (-1 < *(char *)((long)chip + 0xb08))) {
              *(byte *)((long)chip + 0xb05) =
                   *(byte *)((long)chip + 0xb05) | (byte)(1 << ((byte)uVar2 & 0x1f));
            }
          }
        }
        else {
          puVar5 = (undefined1 *)((long)chip + 0x8c2);
          puVar6 = (undefined1 *)((long)chip + 0x8e7);
          for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
            if ((data >> ((uint)lVar3 & 0x1f) & 1) != 0) {
              puVar6[-2] = puVar5[-2];
              puVar6[-1] = puVar5[-1];
              *puVar6 = *puVar5;
              if (-1 < *(char *)((long)chip + 0xb08)) {
                *(byte *)((long)chip + 0xb05) =
                     *(byte *)((long)chip + 0xb05) | (byte)(1 << ((byte)lVar3 & 0x1f));
              }
            }
            puVar5 = puVar5 + 3;
            puVar6 = puVar6 + 0x20;
          }
        }
      }
      else if (uVar2 == 0x215) {
        for (uVar2 = 0; uVar2 != 8; uVar2 = uVar2 + 1) {
          if (((data >> (uVar2 & 0x1f) & 1) != 0) && (-1 < *(char *)((long)chip + 0xb08))) {
            *(byte *)((long)chip + 0xb05) =
                 *(byte *)((long)chip + 0xb05) & ~(byte)(1 << ((byte)uVar2 & 0x1f));
          }
        }
      }
    }
  }
  else {
    bVar1 = *(byte *)((long)chip + 0xb08) & 1;
    if (0xff < offset || (*(byte *)((long)chip + 0xb08) & 1) == 0) goto LAB_0015a1cf;
    if (0xfffffffc < (uVar2 & 0x1f) - 0xf) {
      lVar3 = (ulong)((uVar2 & 0x1f) - 0xc) + (ulong)(offset >> 5) * 3 + 0x8c0;
      goto LAB_0015a327;
    }
  }
  lVar3 = (ulong)offset + 0x8d9;
LAB_0015a327:
  *(UINT8 *)((long)chip + lVar3) = data;
  return;
}

Assistant:

static void k054539_w(void *chip, UINT16 offset, UINT8 data)
{
	k054539_state *info = (k054539_state *)chip;
	UINT8 latch;
	int ch;

	if(0) {
		int voice, reg;

		/* The K054539 has behavior like many other wavetable chips including
		   the Ensoniq 550x and Gravis GF-1: if a voice is active, writing
		   to it's current position is silently ignored.

		   Dadandaan depends on this or the vocals go wrong.
		*/
		if (offset < 8*0x20)
		{
			voice = offset / 0x20;
			reg = offset & ~0x20;

			if(info->regs[0x22c] & (1<<voice))
				if (reg >= 0xc && reg <= 0xe)
					return;
		}
	}

	latch = (info->flags & K054539_UPDATE_AT_KEYON) && (info->regs[0x22f] & 1);

	if (latch && offset < 0x100)
	{
		int offs = (offset & 0x1f) - 0xc;
		ch = offset >> 5;

		if (offs >= 0 && offs <= 2)
		{
			// latch writes to the position index registers
			info->posreg_latch[ch][offs] = data;
			return;
		}
	}

	else
		switch(offset) {
		case 0x13f: {
			int pan = data >= 0x11 && data <= 0x1f ? data - 0x11 : 0x18 - 0x11;
			//if (info->apan_cb != NULL)
			//	info->apan_cb(pantab[pan], pantab[0xe - pan]);
			break;
		}

		case 0x214:
			if (latch)
			{
				for(ch=0; ch<8; ch++)
				{
					if(data & (1<<ch))
					{
						UINT8 *posptr = &info->posreg_latch[ch][0];
						UINT8 *regptr = info->regs + (ch<<5) + 0xc;

						// update the chip at key-on
						regptr[0] = posptr[0];
						regptr[1] = posptr[1];
						regptr[2] = posptr[2];

						k054539_keyon(info, ch);
					}
				}
			}
			else
			{
				for(ch=0; ch<8; ch++)
					if(data & (1<<ch))
						k054539_keyon(info, ch);
			}
		break;

		case 0x215:
			for(ch=0; ch<8; ch++)
				if(data & (1<<ch))
					k054539_keyoff(info, ch);
		break;

		case 0x227:
		{
			//attotime period = attotime::from_hz((float)(38 + data) * (info->clock/384.0f/14400.0f)) / 2.0f;

			//info->timer->adjust(period, 0, period);

			info->timer_state = 0;
			//info->timer_handler(info->timer_state);
		}
		break;

		case 0x22d:
			if(info->regs[0x22e] == 0x80)
				info->cur_zone[info->cur_ptr] = data;
			info->cur_ptr++;
			if(info->cur_ptr == info->cur_limit)
				info->cur_ptr = 0;
		break;

		case 0x22e:
			info->cur_zone =
				data == 0x80 ? info->ram :
				&info->rom[0x20000*data];
			info->cur_limit = data == 0x80 ? 0x4000 : 0x20000;
			info->cur_ptr = 0;
		break;

		case 0x22f:
			if (!(data & 0x20)) // Disable timer output?
			{
				info->timer_state = 0;
				//info->timer_handler(info->timer_state);
			}
		break;

		default:
#if 0
			if(info->regs[offset] != data) {
				if((offset & 0xff00) == 0) {
					chanoff = offset & 0x1f;
					if(chanoff < 4 || chanoff == 5 ||
						(chanoff >=8 && chanoff <= 0xa) ||
						(chanoff >= 0xc && chanoff <= 0xe))
						break;
				}
				if(1 || ((offset >= 0x200) && (offset <= 0x210)))
					break;
				logerror("K054539 %03x = %02x\n", offset, data);
			}
#endif
		break;
	}

	info->regs[offset] = data;
}